

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::SupportVectorRegressor::Clear(SupportVectorRegressor *this)

{
  if (this->kernel_ != (Kernel *)0x0) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->kernel_ = (Kernel *)0x0;
  if (this->coefficients_ != (Coefficients *)0x0) {
    (*(this->coefficients_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->coefficients_ = (Coefficients *)0x0;
  this->rho_ = 0.0;
  clear_supportVectors(this);
  return;
}

Assistant:

void SupportVectorRegressor::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SupportVectorRegressor)
  if (GetArenaNoVirtual() == NULL && kernel_ != NULL) {
    delete kernel_;
  }
  kernel_ = NULL;
  if (GetArenaNoVirtual() == NULL && coefficients_ != NULL) {
    delete coefficients_;
  }
  coefficients_ = NULL;
  rho_ = 0;
  clear_supportVectors();
}